

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O2

void __thiscall SpriteBase::del(SpriteBase *this,PSprite *other)

{
  uint8_t *puVar1;
  size_t sVar2;
  uint8_t *puVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  ulong uVar6;
  
  sVar2 = this->width;
  iVar4 = (*((other->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Sprite[1])();
  if (sVar2 == CONCAT44(extraout_var,iVar4)) {
    sVar2 = this->height;
    iVar4 = (*((other->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              _vptr_Sprite[2])();
    if (sVar2 == CONCAT44(extraout_var_00,iVar4)) {
      iVar4 = (**((other->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 _vptr_Sprite)();
      puVar3 = this->data;
      uVar5 = this->height * this->width;
      for (uVar6 = 0; (uVar6 & 0xffffffff) <= uVar5 && uVar5 - (uVar6 & 0xffffffff) != 0;
          uVar6 = uVar6 + 1) {
        if (*(int *)(CONCAT44(extraout_var_01,iVar4) + uVar6 * 4) == -1) {
          puVar1 = puVar3 + uVar6 * 4;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
        }
      }
    }
  }
  return;
}

Assistant:

void
SpriteBase::del(Data::PSprite other) {
  if ((width != other->get_width()) || (height != other->get_height())) {
    return;
  }

  uint32_t *src = reinterpret_cast<uint32_t*>(other->get_data());
  uint32_t *res = reinterpret_cast<uint32_t*>(data);

  for (unsigned int i = 0; i < width * height; i++) {
    if (*src++ == 0xFFFFFFFF) {
      *res = 0x00000000;
    }
    res++;
  }

  return;
}